

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test::testBody
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test *this)

{
  MemoryLeakDetector *pMVar1;
  bool bVar2;
  TestMemoryAllocator *pTVar3;
  char *pcVar4;
  char *otherBuffer;
  UtestShell *pUVar5;
  size_t sVar6;
  TestTerminator *pTVar7;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  SimpleString output;
  char *mem2;
  char *mem;
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test *this_local;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultNewAllocator();
  pcVar4 = MemoryLeakDetector::allocMemory(pMVar1,pTVar3,4,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultNewAllocator();
  output.bufferSize_ = (size_t)MemoryLeakDetector::allocMemory(pMVar1,pTVar3,0xc,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultNewAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar3,(void *)output.bufferSize_,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  otherBuffer = MemoryLeakDetector::report
                          ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                           mem_leak_period_checking);
  SimpleString::SimpleString((SimpleString *)local_30,otherBuffer);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,sVar6,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x104,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  SimpleString::SimpleString(local_50,"size: 12");
  bVar2 = SimpleString::contains((SimpleString *)local_30,local_50);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)!bVar2,"CHECK","!output.contains(\"size: 12\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x105,pTVar7);
  SimpleString::~SimpleString(local_50);
  pUVar5 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"size: 4");
  bVar2 = SimpleString::contains((SimpleString *)local_30,&local_60);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar2,"CHECK","output.contains(\"size: 4\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x106,pTVar7);
  SimpleString::~SimpleString(&local_60);
  (*PlatformSpecificFree)(pcVar4);
  SimpleString::~SimpleString((SimpleString *)local_30);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeakReverseOrder)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 12);
    detector->deallocMemory(defaultNewAllocator(), mem2);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(!output.contains("size: 12"));
    CHECK(output.contains("size: 4"));
    PlatformSpecificFree(mem);
}